

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O2

SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::lts_20240722::strings_internal::
SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::operator++(SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *this)

{
  undefined1 auVar1 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  do {
    if (this->state_ == kLastState) {
      this->state_ = kEndState;
      return this;
    }
    local_30._M_len = (this->splitter_->text_)._M_len;
    local_30._M_str = (this->splitter_->text_)._M_str;
    auVar1 = absl::lts_20240722::ByChar::Find
                       (&this->delimiter_,local_30._M_len,local_30._M_str,this->pos_);
    if (auVar1._8_8_ == local_30._M_str + local_30._M_len) {
      this->state_ = kLastState;
    }
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_30,this->pos_,
                       (long)auVar1._8_8_ - (long)(local_30._M_str + this->pos_));
    (this->curr_)._M_len = bVar2._M_len;
    (this->curr_)._M_str = bVar2._M_str;
    this->pos_ = this->pos_ + auVar1._0_8_ + bVar2._M_len;
  } while (bVar2._M_len == 0);
  return this;
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }